

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void anon_unknown.dwarf_247d42d::addFileSetEntry
               (cmGeneratorTarget *headTarget,string *config,
               cmGeneratorExpressionDAGChecker *dagChecker,cmFileSet *fileSet,
               EvaluatedTargetPropertyEntries *entries)

{
  int *piVar1;
  pointer pcVar2;
  pointer pcVar3;
  cmMakefile *this;
  size_type sVar4;
  EvaluatedTargetPropertyEntries *this_00;
  cmSourceFile *this_01;
  string *psVar5;
  cmSourceGroup *pcVar6;
  char cVar7;
  string *sourceName;
  cmSourceGroup *sg;
  pointer puVar8;
  pointer this_02;
  string w;
  string e;
  string path;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  dirCges;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  string local_1c8;
  cmFileSet *local_1a8;
  cmGeneratorTarget *local_1a0;
  pointer local_198;
  __uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_190;
  undefined1 local_188 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  cmake *local_150;
  string local_148;
  string local_128;
  TargetPropertyEntry local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  char local_e0;
  _Head_base<0UL,_cmCompiledGeneratorExpression_*,_false> local_d8;
  cmFileSet *local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  EvaluatedTargetPropertyEntries *local_a8;
  pointer local_a0;
  string *local_98;
  cmGeneratorExpressionDAGChecker *local_90;
  pointer local_88;
  string *local_80;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  local_78;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  cmFileSet::CompileDirectoryEntries(&local_60,fileSet);
  local_1a8 = fileSet;
  local_1a0 = headTarget;
  local_98 = config;
  local_90 = dagChecker;
  cmFileSet::EvaluateDirectoryEntries
            (&local_48,fileSet,&local_60,headTarget->LocalGenerator,config,headTarget,dagChecker);
  if (local_60.
      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_60.
      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    cVar7 = '\0';
  }
  else {
    do {
      puVar8 = local_60.
               super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
      cVar7 = (((local_60.
                 super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
              HadContextSensitiveCondition;
      if ((bool)cVar7 != false) break;
      local_60.
      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = puVar8;
    } while (puVar8 != local_60.
                       super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_150 = cmLocalGenerator::GetCMakeInstance(local_1a0->LocalGenerator);
  cmFileSet::CompileFileEntries(&local_78,local_1a8);
  local_a0 = local_78.
             super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_78.
      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar8 = local_78.
             super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_a8 = entries;
    do {
      this_00 = local_a8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_c8,&local_48);
      local_d8._M_head_impl =
           (puVar8->_M_t).
           super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
           .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl;
      (puVar8->_M_t).
      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
           (cmCompiledGeneratorExpression *)0x0;
      local_108.LinkImplItem = &cmGeneratorTarget::TargetPropertyEntry::NoLinkImplItem;
      local_108._vptr_TargetPropertyEntry = (_func_int **)&PTR__TargetPropertyEntryFileSet_00b29858;
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_190._M_t.
      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
           (tuple<cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
            )(_Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
              )0x0;
      local_d0 = local_1a8;
      local_e0 = cVar7;
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)&local_190);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c8);
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
      EvaluateTargetPropertyEntry
                ((EvaluatedTargetPropertyEntry *)local_188,local_1a0,local_98,&local_1c8,local_90,
                 &local_108);
      std::vector<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>::
      emplace_back<EvaluatedTargetPropertyEntry>
                (&this_00->Entries,(EvaluatedTargetPropertyEntry *)local_188);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_170);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_188._17_7_,local_188[0x10])
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT71(local_188._17_7_,local_188[0x10]));
      }
      local_88 = puVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,
                        CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                                 local_1c8.field_2._M_local_buf[0]) + 1);
      }
      local_198 = (this_00->Entries).
                  super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      sourceName = local_198[-1].Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      local_80 = local_198[-1].Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (sourceName != local_80) {
        local_198 = (pointer)&local_198[-1].Backtrace;
        do {
          this_01 = cmMakefile::GetOrCreateSource(local_1a0->Makefile,sourceName,false,Ambiguous);
          if (((local_1a8->Type)._M_string_length == 7) &&
             (piVar1 = (int *)(local_1a8->Type)._M_dataplus._M_p,
             *(int *)((long)piVar1 + 3) == 0x53524544 && *piVar1 == 0x44414548)) {
            local_188._0_8_ = local_188 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_188,"HEADER_FILE_ONLY","");
            local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"TRUE","");
            cmSourceFile::SetProperty(this_01,(string *)local_188,&local_1c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,
                              CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                                       local_1c8.field_2._M_local_buf[0]) + 1);
            }
            if ((cmLinkImplItem *)local_188._0_8_ != (cmLinkImplItem *)(local_188 + 0x10)) {
              operator_delete((void *)local_188._0_8_,CONCAT71(local_188._17_7_,local_188[0x10]) + 1
                             );
            }
          }
          local_188._0_8_ = local_188 + 0x10;
          local_188._8_8_ = (element_type *)0x0;
          local_188[0x10] = '\0';
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          local_1c8._M_string_length = 0;
          local_1c8.field_2._M_local_buf[0] = '\0';
          psVar5 = cmSourceFile::ResolveFullPath(this_01,(string *)local_188,&local_1c8);
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          pcVar2 = (psVar5->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,pcVar2,pcVar2 + psVar5->_M_string_length);
          if (local_1c8._M_string_length != 0) {
            cmake::IssueMessage(local_150,AUTHOR_WARNING,&local_1c8,(cmListFileBacktrace *)local_198
                               );
          }
          sVar4 = local_148._M_string_length;
          if (local_148._M_string_length == 0) {
            if ((element_type *)local_188._8_8_ != (element_type *)0x0) {
              cmake::IssueMessage(local_150,FATAL_ERROR,(string *)local_188,
                                  (cmListFileBacktrace *)local_198);
            }
          }
          else {
            pcVar3 = (local_1a0->Makefile->SourceGroups).
                     super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (this_02 = (local_1a0->Makefile->SourceGroups).
                           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl
                           .super__Vector_impl_data._M_start; this_02 != pcVar3;
                this_02 = this_02 + 1) {
              pcVar6 = cmSourceGroup::MatchChildrenFiles(this_02,&local_148);
              if (pcVar6 != (cmSourceGroup *)0x0) goto LAB_0059fad1;
            }
            if (((local_1a8->Type)._M_string_length == 7) &&
               (piVar1 = (int *)(local_1a8->Type)._M_dataplus._M_p,
               *(int *)((long)piVar1 + 3) == 0x53524544 && *piVar1 == 0x44414548)) {
              this = local_1a0->Makefile;
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_128,"Header Files","");
              pcVar6 = cmMakefile::GetOrCreateSourceGroup(this,&local_128);
              cmSourceGroup::AddGroupFile(pcVar6,&local_148);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                operator_delete(local_128._M_dataplus._M_p,
                                local_128.field_2._M_allocated_capacity + 1);
              }
            }
          }
LAB_0059fad1:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,
                            CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                                     local_1c8.field_2._M_local_buf[0]) + 1);
          }
          if ((cmLinkImplItem *)local_188._0_8_ != (cmLinkImplItem *)(local_188 + 0x10)) {
            operator_delete((void *)local_188._0_8_,CONCAT71(local_188._17_7_,local_188[0x10]) + 1);
          }
          if (sVar4 == 0) {
            local_108._vptr_TargetPropertyEntry =
                 (_func_int **)&PTR__TargetPropertyEntryFileSet_00b29858;
            std::
            unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)&local_d8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_f8);
            goto LAB_0059fbc8;
          }
          sourceName = sourceName + 1;
        } while (sourceName != local_80);
      }
      local_108._vptr_TargetPropertyEntry = (_func_int **)&PTR__TargetPropertyEntryFileSet_00b29858;
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)&local_d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_f8);
      puVar8 = local_88 + 1;
    } while (puVar8 != local_a0);
  }
LAB_0059fbc8:
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector(&local_60);
  return;
}

Assistant:

void addFileSetEntry(cmGeneratorTarget const* headTarget,
                     std::string const& config,
                     cmGeneratorExpressionDAGChecker* dagChecker,
                     cmFileSet const* fileSet,
                     EvaluatedTargetPropertyEntries& entries)
{
  auto dirCges = fileSet->CompileDirectoryEntries();
  auto dirs = fileSet->EvaluateDirectoryEntries(
    dirCges, headTarget->GetLocalGenerator(), config, headTarget, dagChecker);
  bool contextSensitiveDirs = false;
  for (auto const& dirCge : dirCges) {
    if (dirCge->GetHadContextSensitiveCondition()) {
      contextSensitiveDirs = true;
      break;
    }
  }
  cmake* cm = headTarget->GetLocalGenerator()->GetCMakeInstance();
  for (auto& entryCge : fileSet->CompileFileEntries()) {
    TargetPropertyEntryFileSet tpe(dirs, contextSensitiveDirs,
                                   std::move(entryCge), fileSet);
    entries.Entries.emplace_back(
      EvaluateTargetPropertyEntry(headTarget, config, "", dagChecker, tpe));
    EvaluatedTargetPropertyEntry const& entry = entries.Entries.back();
    for (auto const& file : entry.Values) {
      auto* sf = headTarget->Makefile->GetOrCreateSource(file);
      if (fileSet->GetType() == "HEADERS"_s) {
        sf->SetProperty("HEADER_FILE_ONLY", "TRUE");
      }

#ifndef CMAKE_BOOTSTRAP
      std::string e;
      std::string w;
      auto path = sf->ResolveFullPath(&e, &w);
      if (!w.empty()) {
        cm->IssueMessage(MessageType::AUTHOR_WARNING, w, entry.Backtrace);
      }
      if (path.empty()) {
        if (!e.empty()) {
          cm->IssueMessage(MessageType::FATAL_ERROR, e, entry.Backtrace);
        }
        return;
      }
      bool found = false;
      for (auto const& sg : headTarget->Makefile->GetSourceGroups()) {
        if (sg.MatchChildrenFiles(path)) {
          found = true;
          break;
        }
      }
      if (!found) {
        if (fileSet->GetType() == "HEADERS"_s) {
          headTarget->Makefile->GetOrCreateSourceGroup("Header Files")
            ->AddGroupFile(path);
        }
      }
#endif
    }
  }
}